

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_writer.cc
# Opt level: O0

unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
draco::StdioFileWriter::Open(string *file_name)

{
  bool bVar1;
  ulong uVar2;
  char *__filename;
  FILE *__stream;
  StdioFileWriter *this;
  tuple<draco::FileWriterInterface_*,_std::default_delete<draco::FileWriterInterface>_> in_RDI;
  string *unaff_retaddr;
  unique_ptr<draco::StdioFileWriter,_std::default_delete<draco::StdioFileWriter>_> file;
  FILE *raw_file_ptr;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
  *in_stack_ffffffffffffffa0;
  StdioFileWriter *__u;
  _Head_base<0UL,_draco::FileWriterInterface_*,_false> this_00;
  
  this_00._M_head_impl =
       (FileWriterInterface *)
       in_RDI.
       super__Tuple_impl<0UL,_draco::FileWriterInterface_*,_std::default_delete<draco::FileWriterInterface>_>
       .super__Head_base<0UL,_draco::FileWriterInterface_*,_false>._M_head_impl;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = CheckAndCreatePathForFile(unaff_retaddr);
    if (bVar1) {
      __filename = (char *)std::__cxx11::string::c_str();
      __stream = fopen64(__filename,"wb");
      if (__stream == (FILE *)0x0) {
        std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>
        ::unique_ptr<std::default_delete<draco::FileWriterInterface>,void>
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        this = (StdioFileWriter *)operator_new(0x10,(nothrow_t *)&std::nothrow);
        __u = (StdioFileWriter *)0x0;
        if (this != (StdioFileWriter *)0x0) {
          StdioFileWriter(this,(FILE *)in_stack_ffffffffffffff98);
          __u = this;
        }
        std::unique_ptr<draco::StdioFileWriter,std::default_delete<draco::StdioFileWriter>>::
        unique_ptr<std::default_delete<draco::StdioFileWriter>,void>
                  ((unique_ptr<draco::StdioFileWriter,_std::default_delete<draco::StdioFileWriter>_>
                    *)this,in_stack_ffffffffffffff98);
        bVar1 = std::operator==((unique_ptr<draco::StdioFileWriter,_std::default_delete<draco::StdioFileWriter>_>
                                 *)this,in_stack_ffffffffffffff98);
        if (bVar1) {
          fprintf(_stderr,"%s:%d (%s): %s.\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]draco/src/draco/io/stdio_file_writer.cc"
                  ,0x2b,"Open","Out of memory");
          fclose(__stream);
          std::
          unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>::
          unique_ptr<std::default_delete<draco::FileWriterInterface>,void>
                    ((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                      *)this,in_stack_ffffffffffffff98);
        }
        else {
          std::
          unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>::
          unique_ptr<draco::StdioFileWriter,std::default_delete<draco::StdioFileWriter>,void>
                    ((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                      *)this_00._M_head_impl,
                     (unique_ptr<draco::StdioFileWriter,_std::default_delete<draco::StdioFileWriter>_>
                      *)__u);
        }
        std::unique_ptr<draco::StdioFileWriter,_std::default_delete<draco::StdioFileWriter>_>::
        ~unique_ptr((unique_ptr<draco::StdioFileWriter,_std::default_delete<draco::StdioFileWriter>_>
                     *)this);
      }
    }
    else {
      std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>::
      unique_ptr<std::default_delete<draco::FileWriterInterface>,void>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>::
    unique_ptr<std::default_delete<draco::FileWriterInterface>,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_draco::FileWriterInterface_*,_std::default_delete<draco::FileWriterInterface>_>
             .super__Head_base<0UL,_draco::FileWriterInterface_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FileWriterInterface> StdioFileWriter::Open(
    const std::string &file_name) {
  if (file_name.empty()) {
    return nullptr;
  }
  if (!CheckAndCreatePathForFile(file_name)) {
    return nullptr;
  }

  FILE *raw_file_ptr = fopen(file_name.c_str(), "wb");
  if (raw_file_ptr == nullptr) {
    return nullptr;
  }

  std::unique_ptr<StdioFileWriter> file(new (std::nothrow)
                                            StdioFileWriter(raw_file_ptr));
  if (file == nullptr) {
    FILEWRITER_LOG_ERROR("Out of memory");
    fclose(raw_file_ptr);
    return nullptr;
  }

#ifndef DRACO_OLD_GCC
  return file;
#else
  return std::move(file);
#endif
}